

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O3

void __thiscall
Assimp::FBX::Node::AddProperties<std::__cxx11::string,std::__cxx11::string,double,double,double>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more,double more_1,
          double more_2,double more_3)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  pcVar1 = (more->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + more->_M_string_length);
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,&local_40);
  AddProperties<double,double,double>(this,more_1,more_2,more_3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }